

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O3

void __thiscall
cmsys::Glob::ProcessDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  unsigned_long uVar7;
  char *__s;
  long *plVar8;
  size_type *psVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  Directory d;
  string fname;
  string realname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Directory local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  size_type local_50;
  GlobMessages *local_48;
  long local_40;
  ulong local_38;
  
  uVar6 = ((long)(this->Internals->Expressions).
                 super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->Internals->Expressions).
                 super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x4ec4ec4ec4ec4ec5;
  local_98 = uVar6 - 1;
  if ((local_98 == start) && (this->Recurse == true)) {
    RecurseDirectory(this,start,dir,messages);
    return;
  }
  if (start <= uVar6 && uVar6 - start != 0) {
    Directory::Directory(&local_e0);
    bVar4 = Directory::Load(&local_e0,dir);
    if (bVar4) {
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      local_b8._M_string_length = 0;
      local_b8.field_2._M_local_buf[0] = '\0';
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      paVar1 = &local_70.field_2;
      local_50 = start + 1;
      local_40 = start * 0xd0;
      local_48 = messages;
      for (uVar6 = 0; uVar7 = Directory::GetNumberOfFiles(&local_e0), uVar6 < uVar7;
          uVar6 = uVar6 + 1) {
        __s = Directory::GetFile(&local_e0,uVar6);
        sVar3 = local_d8._M_string_length;
        local_38 = uVar6;
        strlen(__s);
        uVar6 = local_38;
        std::__cxx11::string::_M_replace((ulong)&local_d8,0,(char *)sVar3,(ulong)__s);
        iVar5 = std::__cxx11::string::compare((char *)&local_d8);
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_d8), iVar5 != 0))
        {
          if (start == 0) {
            std::operator+(&local_70,dir,&local_d8);
            std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_70);
            uVar10 = local_70.field_2._M_allocated_capacity;
            _Var11._M_p = local_70._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar1) goto LAB_003f0fc8;
          }
          else {
            local_90[0] = &local_80;
            pcVar2 = (dir->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar2,pcVar2 + dir->_M_string_length);
            std::__cxx11::string::append((char *)local_90);
            plVar8 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_90,(ulong)local_d8._M_dataplus._M_p);
            psVar9 = (size_type *)(plVar8 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar8 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar9) {
              local_70.field_2._M_allocated_capacity = *psVar9;
              local_70.field_2._8_8_ = plVar8[3];
              local_70._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_70.field_2._M_allocated_capacity = *psVar9;
              local_70._M_dataplus._M_p = (pointer)*plVar8;
            }
            local_70._M_string_length = plVar8[1];
            *plVar8 = (long)psVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != paVar1) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            uVar10 = local_80._M_allocated_capacity;
            _Var11._M_p = (pointer)local_90[0];
            if (local_90[0] != &local_80) {
LAB_003f0fc8:
              operator_delete(_Var11._M_p,uVar10 + 1);
            }
          }
          if (local_98 == start) {
            if ((this->ListDirs != false) ||
               (bVar4 = SystemTools::FileIsDirectory(&local_b8), !bVar4)) {
LAB_003f1004:
              bVar4 = RegularExpression::find
                                ((RegularExpression *)
                                 ((long)((this->Internals->Expressions).
                                         super__Vector_base<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->startp +
                                 local_40),local_d8._M_dataplus._M_p);
              if (bVar4) {
                if (local_98 == start) {
                  AddFile(this,&this->Internals->Files,&local_b8);
                }
                else {
                  ProcessDirectory(this,local_50,&local_b8,local_48);
                }
              }
            }
          }
          else {
            bVar4 = SystemTools::FileIsDirectory(&local_b8);
            if (bVar4) goto LAB_003f1004;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                 local_d8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
    }
    Directory::~Directory(&local_e0);
  }
  return;
}

Assistant:

void Glob::ProcessDirectory(kwsys_stl::string::size_type start,
  const kwsys_stl::string& dir, GlobMessages* messages)
{
  //kwsys_ios::cout << "ProcessDirectory: " << dir << kwsys_ios::endl;
  bool last = ( start == this->Internals->Expressions.size()-1 );
  if ( last && this->Recurse )
    {
    this->RecurseDirectory(start, dir, messages);
    return;
    }

  if ( start >= this->Internals->Expressions.size() )
    {
    return;
    }

  kwsys::Directory d;
  if ( !d.Load(dir) )
    {
    return;
    }
  unsigned long cc;
  kwsys_stl::string realname;
  kwsys_stl::string fname;
  for ( cc = 0; cc < d.GetNumberOfFiles(); cc ++ )
    {
    fname = d.GetFile(cc);
    if ( fname == "." || fname == ".." )
      {
      continue;
      }

    if ( start == 0 )
      {
      realname = dir + fname;
      }
    else
      {
      realname = dir + "/" + fname;
      }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On case-insensitive file systems convert to lower case for matching.
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    //kwsys_ios::cout << "Look at file: " << fname << kwsys_ios::endl;
    //kwsys_ios::cout << "Match: "
    // << this->Internals->TextExpressions[start].c_str() << kwsys_ios::endl;
    //kwsys_ios::cout << "Real name: " << realname << kwsys_ios::endl;

    if( (!last && !kwsys::SystemTools::FileIsDirectory(realname))
      || (!this->ListDirs && last &&
          kwsys::SystemTools::FileIsDirectory(realname)) )
      {
      continue;
      }

    if ( this->Internals->Expressions[start].find(fname) )
      {
      if ( last )
        {
        this->AddFile(this->Internals->Files, realname);
        }
      else
        {
        this->ProcessDirectory(start+1, realname, messages);
        }
      }
    }
}